

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O1

void __thiscall
spdlog::details::thread_pool::post_flush
          (thread_pool *this,async_logger_ptr *worker_ptr,async_overflow_policy overflow_policy)

{
  async_msg local_1c0;
  
  memset(&local_1c0,0,0x180);
  local_1c0.super_log_msg_buffer.super_log_msg.level = off;
  local_1c0.super_log_msg_buffer.super_log_msg.time.__d.__r = (duration)0;
  local_1c0.super_log_msg_buffer.super_log_msg.thread_id = 0;
  local_1c0.super_log_msg_buffer.super_log_msg.color_range_start = 0;
  local_1c0.super_log_msg_buffer.super_log_msg.color_range_end._0_4_ = 0;
  local_1c0.super_log_msg_buffer.super_log_msg.color_range_end._4_4_ = 0;
  local_1c0.super_log_msg_buffer.super_log_msg.source.filename._0_4_ = 0;
  local_1c0.super_log_msg_buffer.super_log_msg.source._4_8_ = 0;
  local_1c0.super_log_msg_buffer.super_log_msg.source.funcname = (char *)0x0;
  local_1c0.super_log_msg_buffer.super_log_msg.payload.data_ = (char *)0x0;
  local_1c0.super_log_msg_buffer.super_log_msg.payload.size_ = 0;
  local_1c0.super_log_msg_buffer.buffer.super_buffer<char>.size_ = 0;
  local_1c0.super_log_msg_buffer.buffer.super_buffer<char>._vptr_buffer =
       (_func_int **)&PTR_grow_001e5910;
  local_1c0.super_log_msg_buffer.buffer.super_buffer<char>.ptr_ =
       local_1c0.super_log_msg_buffer.buffer.store_;
  local_1c0.super_log_msg_buffer.buffer.super_buffer<char>.capacity_ = 0xfa;
  local_1c0.msg_type = flush;
  local_1c0.worker_ptr.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (worker_ptr->super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1c0.worker_ptr.super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (worker_ptr->super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (worker_ptr->super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (worker_ptr->super___shared_ptr<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  if (overflow_policy == block) {
    mpmc_blocking_queue<spdlog::details::async_msg>::enqueue(&this->q_,&local_1c0);
  }
  else {
    mpmc_blocking_queue<spdlog::details::async_msg>::enqueue_nowait(&this->q_,&local_1c0);
  }
  async_msg::~async_msg(&local_1c0);
  return;
}

Assistant:

void SPDLOG_INLINE thread_pool::post_flush(async_logger_ptr &&worker_ptr, async_overflow_policy overflow_policy)
{
    post_async_msg_(async_msg(std::move(worker_ptr), async_msg_type::flush), overflow_policy);
}